

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O2

int run_test_part(char *test,char *part)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar1;
  _func_int **pp_Var2;
  
  pp_Var2 = &TASKS[0].main;
  do {
    UNRECOVERED_JUMPTABLE = *pp_Var2;
    if (UNRECOVERED_JUMPTABLE == (_func_int *)0x0) {
      fprintf(_stderr,"No test part with that name: %s:%s\n",test,part);
      fflush(_stderr);
      return 0xff;
    }
    iVar1 = strcmp(test,((task_entry_t *)(pp_Var2 + -2))->task_name);
    if (iVar1 == 0) {
      iVar1 = strcmp(part,(char *)pp_Var2[-1]);
      if (iVar1 == 0) {
        iVar1 = (*UNRECOVERED_JUMPTABLE)();
        return iVar1;
      }
    }
    pp_Var2 = pp_Var2 + 5;
  } while( true );
}

Assistant:

int run_test_part(const char* test, const char* part) {
  task_entry_t* task;
  int r;

  for (task = TASKS; task->main; task++) {
    if (strcmp(test, task->task_name) == 0 &&
        strcmp(part, task->process_name) == 0) {
      r = task->main();
      return r;
    }
  }

  fprintf(stderr, "No test part with that name: %s:%s\n", test, part);
  fflush(stderr);
  return 255;
}